

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O1

void ** __thiscall QThreadStorageData::set(QThreadStorageData *this,void *p)

{
  int iVar1;
  void *pvVar2;
  QBasicMutex copy;
  QThreadData *pQVar3;
  pointer ppvVar4;
  Type *pTVar5;
  QBasicMutex *this_00;
  _func_void_void_ptr *p_Var6;
  
  pQVar3 = QThreadData::currentThreadData();
  if (pQVar3 == (QThreadData *)0x0) {
    pQVar3 = QThreadData::createCurrentThreadData();
  }
  if (pQVar3 == (QThreadData *)0x0) {
    set();
    ppvVar4 = (pointer)0x0;
  }
  else {
    this_00 = (QBasicMutex *)&pQVar3->tls;
    if ((pQVar3->tls).d.size <= (long)this->id) {
      QList<void_*>::resize((QList<void_*> *)this_00,(long)this->id + 1);
    }
    iVar1 = this->id;
    ppvVar4 = QList<void_*>::data((QList<void_*> *)this_00);
    ppvVar4 = ppvVar4 + iVar1;
    if (*ppvVar4 != (void *)0x0) {
      if ((AtomicType)destructorsMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
        LOCK();
        destructorsMutex.d_ptr._q_value._M_b._M_p =
             (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
        UNLOCK();
      }
      else {
        this_00 = &destructorsMutex;
        QBasicMutex::lockInternal(&destructorsMutex);
      }
      pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
               operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
                           *)this_00);
      copy = destructorsMutex;
      if ((pTVar5 == (Type *)0x0) || ((ulong)(pTVar5->d).size <= (ulong)(long)this->id)) {
        p_Var6 = (_func_void_void_ptr *)0x0;
      }
      else {
        p_Var6 = (pTVar5->d).ptr[this->id];
      }
      LOCK();
      destructorsMutex.d_ptr._q_value._M_b._M_p =
           (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
      UNLOCK();
      if ((AtomicType)copy.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
        QBasicMutex::unlockInternalFutex(&destructorsMutex,(void *)copy.d_ptr._q_value._M_b._M_p);
      }
      pvVar2 = *ppvVar4;
      *ppvVar4 = (void *)0x0;
      if (p_Var6 != (_func_void_void_ptr *)0x0) {
        (*p_Var6)(pvVar2);
      }
    }
    *ppvVar4 = p;
  }
  return ppvVar4;
}

Assistant:

void **QThreadStorageData::set(void *p)
{
    QThreadData *data = QThreadData::current();
    if (!data) {
        qWarning("QThreadStorage::set: QThreadStorage can only be used with threads started with QThread");
        return nullptr;
    }
    QList<void *> &tls = data->tls;
    if (tls.size() <= id)
        tls.resize(id + 1);

    void *&value = tls[id];
    // delete any previous data
    if (value != nullptr) {
        DEBUG_MSG("QThreadStorageData: Deleting previous storage %d, data %p, for thread %p",
                id,
                value,
                data->thread.loadRelaxed());

        QMutexLocker locker(&destructorsMutex);
        DestructorMap *destr = destructors();
        void (*destructor)(void *) = destr ? destr->value(id) : nullptr;
        locker.unlock();

        void *q = value;
        value = nullptr;

        if (destructor)
            destructor(q);
    }

    // store new data
    value = p;
    DEBUG_MSG("QThreadStorageData: Set storage %d for thread %p to %p", id, data->thread.loadRelaxed(), p);
    return &value;
}